

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

void ht_timeline_destroy(HT_Timeline *timeline)

{
  ulong local_18;
  size_t i;
  HT_Timeline *timeline_local;
  
  if (timeline != (HT_Timeline *)0x0) {
    ht_timeline_flush(timeline);
    ht_free(timeline->buffer);
    ht_timeline_listener_container_unref(timeline->listeners);
    for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
      if (timeline->features[local_18] != (HT_Feature *)0x0) {
        (*timeline->features[local_18]->klass->destroy)(timeline->features[local_18]);
        timeline->features[local_18] = (HT_Feature *)0x0;
      }
    }
    if (timeline->locking_policy != (_HT_Mutex *)0x0) {
      ht_mutex_destroy(timeline->locking_policy);
    }
    ht_free(timeline);
    return;
  }
  __assert_fail("timeline",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O0/hawktracer.cpp"
                ,0x7ca,"void ht_timeline_destroy(HT_Timeline *)");
}

Assistant:

void
ht_timeline_destroy(HT_Timeline* timeline)
{
    size_t i;

    assert(timeline);

    ht_timeline_flush(timeline);
    ht_free(timeline->buffer);

    ht_timeline_listener_container_unref(timeline->listeners);

    for (i = 0; i < sizeof(timeline->features) / sizeof(timeline->features[0]); i++)
    {
        if (timeline->features[i])
        {
            timeline->features[i]->klass->destroy(timeline->features[i]);
            timeline->features[i] = NULL;
        }
    }

    if (timeline->locking_policy)
    {
        ht_mutex_destroy(timeline->locking_policy);
    }

    ht_free(timeline);
}